

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_poll.c
# Opt level: O0

int getrandom_wrapper(void *buf,size_t buflen,uint flags)

{
  long lVar1;
  uint flags_local;
  size_t buflen_local;
  void *buf_local;
  
  lVar1 = syscall(0x13e,buf,buflen,(ulong)flags);
  return (int)lVar1;
}

Assistant:

static int getrandom_wrapper( void *buf, size_t buflen, unsigned int flags )
{
    /* MemSan cannot understand that the syscall writes to the buffer */
#if defined(__has_feature)
#if __has_feature(memory_sanitizer)
    memset( buf, 0, buflen );
#endif
#endif

    return( syscall( SYS_getrandom, buf, buflen, flags ) );
}